

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__convert_16_to_8(stbi__uint16 *orig,int w,int h,int channels)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  stbi_uc *reduced;
  int img_len;
  int i;
  int local_20;
  stbi_uc *local_8;
  
  local_8 = (stbi_uc *)stbi__malloc(0x606a71);
  if (local_8 == (stbi_uc *)0x0) {
    stbi__err("outofmem");
    local_8 = (stbi_uc *)0x0;
  }
  else {
    for (local_20 = 0; local_20 < in_ESI * in_EDX * in_ECX; local_20 = local_20 + 1) {
      local_8[local_20] = (stbi_uc)((ushort)*(undefined2 *)((long)in_RDI + (long)local_20 * 2) >> 8)
      ;
    }
    free(in_RDI);
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__convert_16_to_8(stbi__uint16 *orig, int w, int h, int channels)
{
   int i;
   int img_len = w * h * channels;
   stbi_uc *reduced;

   reduced = (stbi_uc *) stbi__malloc(img_len);
   if (reduced == NULL) return stbi__errpuc("outofmem", "Out of memory");

   for (i = 0; i < img_len; ++i)
      reduced[i] = (stbi_uc)((orig[i] >> 8) & 0xFF); // top half of each byte is sufficient approx of 16->8 bit scaling

   STBI_FREE(orig);
   return reduced;
}